

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_debug_note_teardown_(event *ev)

{
  event_debug_entry *peVar1;
  uint u;
  event_debug_entry *peVar2;
  
  if (event_debug_mode_on_ != 0) {
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
    }
    if (global_debug_map.hth_table == (event_debug_entry **)0x0) {
      peVar1 = (event_debug_entry *)0x0;
    }
    else {
      peVar2 = (event_debug_entry *)
               (global_debug_map.hth_table +
               ((ulong)ev >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
      do {
        peVar1 = peVar2;
        peVar2 = (peVar1->node).hte_next;
        if (peVar2 == (event_debug_entry *)0x0) break;
      } while (peVar2->ptr != ev);
    }
    if ((peVar1 == (event_debug_entry *)0x0) ||
       (peVar2 = (peVar1->node).hte_next, peVar2 == (event_debug_entry *)0x0)) {
      peVar2 = (event_debug_entry *)0x0;
    }
    else {
      (peVar1->node).hte_next = (peVar2->node).hte_next;
      (peVar2->node).hte_next = (event_debug_entry *)0x0;
      global_debug_map.hth_n_entries = global_debug_map.hth_n_entries - 1;
    }
    if (peVar2 != (event_debug_entry *)0x0) {
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
        free(peVar2);
      }
      else {
        (*mm_free_fn_)(peVar2);
      }
    }
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
    }
  }
  event_debug_mode_too_late = 1;
  return;
}

Assistant:

static void event_debug_note_teardown_(const struct event *ev)
{
	struct event_debug_entry *dent, find;

	if (!event_debug_mode_on_)
		goto out;

	find.ptr = ev;
	EVLOCK_LOCK(event_debug_map_lock_, 0);
	dent = HT_REMOVE(event_debug_map, &global_debug_map, &find);
	if (dent)
		mm_free(dent);
	EVLOCK_UNLOCK(event_debug_map_lock_, 0);

out:
	event_debug_mode_too_late = 1;
}